

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

_Bool ggml_backend_sched_reserve(ggml_backend_sched_t sched,ggml_cgraph *measure_graph)

{
  _Bool _Var1;
  long in_RSI;
  ggml_backend_sched_t in_RDI;
  int *in_stack_00000080;
  int *in_stack_00000088;
  ggml_cgraph *in_stack_00000090;
  ggml_gallocr_t in_stack_00000098;
  ggml_cgraph *in_stack_000003a8;
  ggml_backend_sched_t in_stack_000003b0;
  
  if (*(int *)(in_RSI + 4) + *(int *)(in_RSI + 8) <= (int)(in_RDI->hash_set).size) {
    ggml_backend_sched_split_graph(in_stack_000003b0,in_stack_000003a8);
    ggml_backend_sched_synchronize(in_RDI);
    _Var1 = ggml_gallocr_reserve_n
                      (in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080);
    if (_Var1) {
      ggml_backend_sched_reset((ggml_backend_sched_t)0x15fabe);
    }
    return _Var1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,0x607,"GGML_ASSERT(%s) failed",
             "(int)sched->hash_set.size >= measure_graph->n_nodes + measure_graph->n_leafs");
}

Assistant:

bool ggml_backend_sched_reserve(ggml_backend_sched_t sched, struct ggml_cgraph * measure_graph) {
    GGML_ASSERT((int)sched->hash_set.size >= measure_graph->n_nodes + measure_graph->n_leafs);

    ggml_backend_sched_split_graph(sched, measure_graph);

    ggml_backend_sched_synchronize(sched);

    if (!ggml_gallocr_reserve_n(sched->galloc, &sched->graph, sched->node_backend_ids, sched->leaf_backend_ids)) {
        return false;
    }

    ggml_backend_sched_reset(sched);

    return true;
}